

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
* __thiscall
ninx::lexer::Lexer::generate
          (vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
           *__return_storage_ptr__,Lexer *this)

{
  Reader *this_00;
  pointer puVar1;
  pointer puVar2;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  *pvVar3;
  bool bVar4;
  int iVar5;
  int line_number;
  Keyword *pKVar6;
  ostream *poVar7;
  iterator __begin2;
  bool lateSelectorFound;
  int trailing_spaces;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  tokens;
  bool local_81;
  undefined1 local_80 [36];
  int local_5c;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  local_58;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  *local_40;
  Lexer *local_38;
  
  local_58.
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->reader;
  local_40 = __return_storage_ptr__;
  local_38 = this;
  do {
    while( true ) {
      iVar5 = Reader::get_next_limiter(this_00);
      puVar2 = local_58.
               super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5 == -1) {
        puVar1 = local_58.
                 super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_38->verbose == true) {
          for (; puVar1 != puVar2; puVar1 = puVar1 + 1) {
            poVar7 = token::operator<<((ostream *)&std::cout,
                                       (puVar1->_M_t).
                                       super___uniq_ptr_impl<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
                                       .super__Head_base<0UL,_ninx::lexer::token::Token_*,_false>.
                                       _M_head_impl);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
        }
        pvVar3 = local_40;
        (local_40->
        super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start =
             local_58.
             super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (local_40->
        super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (local_40->
        super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_58.
             super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_58.
        super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.
        super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.
        super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
        ::~vector(&local_58);
        return pvVar3;
      }
      if (iVar5 < 1) break;
      if (iVar5 == 0x24) {
        iVar5 = Reader::get_line_number(this_00);
        Reader::read_identifier_abi_cxx11_((string *)local_80,this_00,&local_5c);
        pKVar6 = (Keyword *)operator_new(0x38);
        token::Variable::Variable((Variable *)pKVar6,iVar5,(string *)local_80);
        if ((Keyword *)local_80._0_8_ != (Keyword *)(local_80 + 0x10)) {
          operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
        }
        token::Variable::set_trailing_spaces((Variable *)pKVar6,local_5c);
        local_80._0_8_ = pKVar6;
        std::
        vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
        ::
        emplace_back<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>
                  ((vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
                    *)&local_58,
                   (unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                    *)local_80);
      }
      else if (iVar5 == 0x40) {
        local_81 = false;
        iVar5 = Reader::get_line_number(this_00);
        Reader::read_identifier_abi_cxx11_((string *)local_80,this_00,&local_5c,0x3f,&local_81);
        pKVar6 = (Keyword *)operator_new(0x38);
        token::Keyword::Keyword(pKVar6,iVar5,(string *)local_80);
        if ((Keyword *)local_80._0_8_ != (Keyword *)(local_80 + 0x10)) {
          operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
        }
        if (local_81 == true) {
          token::Keyword::set_late(pKVar6,true);
        }
        local_80._0_8_ = pKVar6;
        std::
        vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
        ::
        emplace_back<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>
                  ((vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
                    *)&local_58,
                   (unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                    *)local_80);
      }
      else {
        line_number = Reader::get_line_number(this_00);
        pKVar6 = (Keyword *)operator_new(0x10);
        token::Limiter::Limiter((Limiter *)pKVar6,line_number,(char)iVar5);
        local_80._0_8_ = pKVar6;
        std::
        vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
        ::
        emplace_back<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>
                  ((vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
                    *)&local_58,
                   (unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                    *)local_80);
      }
LAB_0010c697:
      if ((Keyword *)local_80._0_8_ != (Keyword *)0x0) {
        (**(code **)(*(long *)local_80._0_8_ + 8))();
      }
    }
    iVar5 = Reader::get_line_number(this_00);
    Reader::read_until_limiter_abi_cxx11_((string *)local_80,this_00);
    pKVar6 = (Keyword *)operator_new(0x38);
    token::Text::Text((Text *)pKVar6,iVar5,(string *)local_80);
    if ((Keyword *)local_80._0_8_ != (Keyword *)(local_80 + 0x10)) {
      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
    }
    bVar4 = token::Text::is_empty((Text *)pKVar6);
    if (!bVar4) {
      local_80._0_8_ = pKVar6;
      std::
      vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
      ::
      emplace_back<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>
                ((vector<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>,std::allocator<std::unique_ptr<ninx::lexer::token::Token,std::default_delete<ninx::lexer::token::Token>>>>
                  *)&local_58,
                 (unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                  *)local_80);
      goto LAB_0010c697;
    }
    (*(pKVar6->super_Token)._vptr_Token[1])(pKVar6);
  } while( true );
}

Assistant:

std::vector<std::unique_ptr<Token>> ninx::lexer::Lexer::generate() {
    std::vector<std::unique_ptr<Token>> tokens;

    while(true) {
        int next_limiter = reader.get_next_limiter();
        if (next_limiter == -1) {  // EOF
            break;
        }

        if (next_limiter > 0) {  // A limiter was found
            switch (next_limiter) {
                case '@':  // Keyword beginning
                {
                    bool lateSelectorFound = false;
                    int trailing_spaces;
                    auto keywordToken = std::make_unique<Keyword>(reader.get_line_number(), reader.read_identifier(trailing_spaces, '?', lateSelectorFound));

                    if (lateSelectorFound) {
                        keywordToken->set_late(true);
                    }

                    tokens.push_back(std::move(keywordToken));
                    break;
                }
                case '$':  // Variable beginning
                {
                    int trailing_spaces;
                    auto variableToken = std::make_unique<Variable>(reader.get_line_number(),
                                                                    reader.read_identifier(trailing_spaces));
                    variableToken->set_trailing_spaces(trailing_spaces);
                    tokens.push_back(std::move(variableToken));
                    break;
                }
                default:   // Other limiters, mark them as generic limiters
                {
                    auto limiterToken = std::make_unique<Limiter>(reader.get_line_number(), static_cast<char>(next_limiter));
                    tokens.push_back(std::move(limiterToken));
                }
            }
        }else{  // A limiter was not found, it is a simple text
            auto token = std::make_unique<Text>(reader.get_line_number(), reader.read_until_limiter());
            // Only add non-empty tokens
            if (!token->is_empty()) {
                tokens.push_back(std::move(token));
            }
        }
    }

    if (verbose) {
        for (auto &token : tokens) {
            std::cout << *token << std::endl;
        }
    }

    return std::move(tokens);
}